

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.c
# Opt level: O0

axbStatus_t axbMatSetValuesDense(axbMat_s *mat,void *values,axbDataType_t values_datatype)

{
  uint uVar1;
  undefined4 *__ptr;
  void *__ptr_00;
  int local_44;
  int local_40;
  int j;
  int i;
  int index;
  int *tmp_cols;
  int *tmp_rows;
  axbStatus_t status;
  axbDataType_t values_datatype_local;
  void *values_local;
  axbMat_s *mat_local;
  
  if (mat->init != 0x1d233) {
    fprintf(_stderr,"ERROR in %s: Matrix not yet initialized. Call to axbMatCreateEnd() required.\n"
            ,"axbMatSetValuesDense");
    return mat->init;
  }
  if (mat->storage_type == AXB_STORAGE_CSR) {
    uVar1 = axbMemBackendFree(mat->memBackend,mat->row_markers);
    if (uVar1 != 0) {
      fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
              ,0x95,(ulong)uVar1);
      if (uVar1 == 0) {
        return 0;
      }
      __assert_fail("status==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                    ,0x95,
                    "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
    }
    uVar1 = axbMemBackendFree(mat->memBackend,mat->col_indices);
    if (uVar1 != 0) {
      fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
              ,0x96,(ulong)uVar1);
      if (uVar1 == 0) {
        return 0;
      }
      __assert_fail("status==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                    ,0x96,
                    "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
    }
    uVar1 = axbMemBackendFree(mat->memBackend,mat->values);
    if (uVar1 != 0) {
      fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
              ,0x97,(ulong)uVar1);
      if (uVar1 == 0) {
        return 0;
      }
      __assert_fail("status==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                    ,0x97,
                    "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
    }
    uVar1 = axbMemBackendMalloc(mat->memBackend,(mat->rows + 1) * 4,&mat->row_markers);
    if (uVar1 != 0) {
      fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
              ,0x99,(ulong)uVar1);
      if (uVar1 == 0) {
        return 0;
      }
      __assert_fail("status==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                    ,0x99,
                    "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
    }
    uVar1 = axbMemBackendMalloc(mat->memBackend,mat->rows * mat->cols * 4,&mat->col_indices);
    if (uVar1 != 0) {
      fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
              ,0x9a,(ulong)uVar1);
      if (uVar1 == 0) {
        return 0;
      }
      __assert_fail("status==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                    ,0x9a,
                    "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
    }
    uVar1 = axbMemBackendMalloc(mat->memBackend,mat->rows * mat->cols * 8,&mat->values);
    if (uVar1 != 0) {
      fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
              ,0x9b,(ulong)uVar1);
      if (uVar1 == 0) {
        return 0;
      }
      __assert_fail("status==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                    ,0x9b,
                    "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
    }
    __ptr = (undefined4 *)malloc((mat->rows + 1) * 4);
    __ptr_00 = malloc(mat->rows * mat->cols * 4);
    *__ptr = 0;
    j = 0;
    for (local_40 = 0; local_40 < (int)mat->rows; local_40 = local_40 + 1) {
      for (local_44 = 0; local_44 < (int)mat->cols; local_44 = local_44 + 1) {
        *(int *)((long)__ptr_00 + (long)j * 4) = local_44;
        j = j + 1;
      }
      __ptr[local_40 + 1] = j;
    }
    uVar1 = axbMemBackendCopyIn(mat->memBackend,values,values_datatype,mat->row_markers,
                                mat->row_markers_datatype,mat->rows + 1);
    if (uVar1 != 0) {
      fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
              ,0xaa,(ulong)uVar1);
      if (uVar1 == 0) {
        return 0;
      }
      __assert_fail("status==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                    ,0xaa,
                    "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
    }
    uVar1 = axbMemBackendCopyIn(mat->memBackend,values,values_datatype,mat->col_indices,
                                mat->col_indices_datatype,mat->rows * mat->cols);
    if (uVar1 != 0) {
      fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
              ,0xab,(ulong)uVar1);
      if (uVar1 == 0) {
        return 0;
      }
      __assert_fail("status==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                    ,0xab,
                    "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
    }
    uVar1 = axbMemBackendCopyIn(mat->memBackend,values,values_datatype,mat->values,
                                mat->values_datatype,mat->rows * mat->cols);
    if (uVar1 != 0) {
      fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
              ,0xac,(ulong)uVar1);
      if (uVar1 == 0) {
        return 0;
      }
      __assert_fail("status==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                    ,0xac,
                    "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
    }
    free(__ptr);
    free(__ptr_00);
  }
  else {
    if (mat->storage_type != AXB_STORAGE_DENSE) {
      return 1;
    }
    uVar1 = axbMemBackendCopyIn(mat->memBackend,values,values_datatype,mat->values,
                                mat->values_datatype,mat->rows * mat->cols);
    if (uVar1 != 0) {
      fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
              ,0xb3,(ulong)uVar1);
      if (uVar1 == 0) {
        return 0;
      }
      __assert_fail("status==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/mat.c"
                    ,0xb3,
                    "axbStatus_t axbMatSetValuesDense(struct axbMat_s *, void *, axbDataType_t)");
    }
  }
  return 0;
}

Assistant:

axbStatus_t axbMatSetValuesDense(struct axbMat_s *mat, void *values, axbDataType_t values_datatype)
{
  if (mat->init != 119347) {
    fprintf(stderr, "ERROR in %s: Matrix not yet initialized. Call to axbMatCreateEnd() required.\n", __func__);
    return mat->init;
  }

  axbStatus_t status;
  if (mat->storage_type == AXB_STORAGE_CSR) {

    status = axbMemBackendFree(mat->memBackend, mat->row_markers); AXB_ERRCHK(status);
    status = axbMemBackendFree(mat->memBackend, mat->col_indices); AXB_ERRCHK(status);
    status = axbMemBackendFree(mat->memBackend, mat->values); AXB_ERRCHK(status);

    status = axbMemBackendMalloc(mat->memBackend, sizeof(int)    * (mat->rows+1),           &(mat->row_markers)); AXB_ERRCHK(status);
    status = axbMemBackendMalloc(mat->memBackend, sizeof(int)    * (mat->rows * mat->cols), &(mat->col_indices)); AXB_ERRCHK(status);
    status = axbMemBackendMalloc(mat->memBackend, sizeof(double) * (mat->rows * mat->cols), &(mat->values)); AXB_ERRCHK(status);

    // create temporary array for rows and columns:
    int *tmp_rows = malloc(sizeof(int)    * (mat->rows+1));
    int *tmp_cols = malloc(sizeof(int)    * (mat->rows * mat->cols));

    tmp_rows[0] = 0;
    int index = 0;
    for (int i=0; i<(int)mat->rows; ++i) {
      for (int j=0; j<(int)mat->cols; ++j) {
        tmp_cols[index++] = j;
      }
      tmp_rows[i+1] = index;
    }

    status = axbMemBackendCopyIn(mat->memBackend, values, values_datatype, mat->row_markers, mat->row_markers_datatype, mat->rows + 1); AXB_ERRCHK(status);
    status = axbMemBackendCopyIn(mat->memBackend, values, values_datatype, mat->col_indices, mat->col_indices_datatype, mat->rows * mat->cols); AXB_ERRCHK(status);
    status = axbMemBackendCopyIn(mat->memBackend, values, values_datatype, mat->values,      mat->values_datatype,      mat->rows * mat->cols); AXB_ERRCHK(status);

    free(tmp_rows);
    free(tmp_cols);
  }
  else if (mat->storage_type == AXB_STORAGE_DENSE)
  {
    status = axbMemBackendCopyIn(mat->memBackend, values, values_datatype, mat->values, mat->values_datatype, mat->rows * mat->cols); AXB_ERRCHK(status);
  } else {
    // TODO: implement
    return 1;
  }

  return 0;
}